

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QSize __thiscall QTreeView::viewportSizeHint(QTreeView *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTreeViewPrivate *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  QModelIndex *unaff_retaddr;
  QTreeViewPrivate *in_stack_00000008;
  QTreeViewPrivate *d;
  QRect deepestRect;
  QSize result;
  QSize *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  QSize local_10;
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QTreeView *)0x8fe62a);
  QAbstractItemViewPrivate::executePostedLayout
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  qVar5 = QList<QTreeViewItem>::size(&pQVar4->viewItems);
  if (qVar5 == 0) {
    local_10 = QAbstractItemView::viewportSizeHint((QAbstractItemView *)in_stack_ffffffffffffffa8);
  }
  else {
    QList<QTreeViewItem>::last((QList<QTreeViewItem> *)in_stack_ffffffffffffffa8);
    QTreeViewPrivate::visualRect(in_stack_00000008,unaff_retaddr,(RectRule)((ulong)lVar6 >> 0x20));
    bVar1 = QRect::isValid((QRect *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (bVar1) {
      local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      iVar2 = QHeaderView::length((QHeaderView *)
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      QRect::bottom((QRect *)0x8fe700);
      QSize::QSize((QSize *)CONCAT44(iVar2,in_stack_ffffffffffffffb0),
                   (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(int)in_stack_ffffffffffffffa8);
      bVar1 = QWidget::isHidden((QWidget *)0x8fe724);
      if (bVar1) {
        iVar3 = 0;
      }
      else {
        iVar3 = QWidget::height((QWidget *)0x8fe743);
      }
      QSize::QSize((QSize *)CONCAT44(iVar2,iVar3),(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (int)in_stack_ffffffffffffffa8);
      QSize::operator+=((QSize *)CONCAT44(iVar2,iVar3),in_stack_ffffffffffffffa8);
    }
    else {
      local_10 = QAbstractItemView::viewportSizeHint((QAbstractItemView *)in_stack_ffffffffffffffa8)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar6) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QTreeView::viewportSizeHint() const
{
    Q_D(const QTreeView);
    d->executePostedLayout(); // Make sure that viewItems are up to date.

    if (d->viewItems.size() == 0)
        return QAbstractItemView::viewportSizeHint();

    // Get rect for last item
    const QRect deepestRect = d->visualRect(d->viewItems.last().index,
                                            QTreeViewPrivate::SingleSection);

    if (!deepestRect.isValid())
        return QAbstractItemView::viewportSizeHint();

    QSize result = QSize(d->header->length(), deepestRect.bottom() + 1);

    // add size for header
    result += QSize(0, d->header->isHidden() ? 0 : d->header->height());

    return result;
}